

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

uint32_t __thiscall Cache::getAddr(Cache *this,Block *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  Cache *this_00;
  
  this_00 = this;
  uVar1 = log2i(this,(this->policy).blockSize);
  uVar2 = log2i(this_00,(this->policy).blockNum / (this->policy).associativity);
  return b->id << ((byte)uVar1 & 0x1f) | b->tag << ((char)uVar2 + (byte)uVar1 & 0x1f);
}

Assistant:

uint32_t Cache::getAddr(Cache::Block &b) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  return (b.tag << (offsetBits + idBits)) | (b.id << offsetBits);
}